

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersector1<4,_16777232,_false,_embree::avx512::ArrayIntersector1<embree::avx512::TriangleMiMBIntersector1Moeller<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  undefined8 *puVar2;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  Geometry *pGVar8;
  RTCIntersectArguments *pRVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  uint uVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  float *vertices;
  ulong *puVar29;
  byte bVar30;
  byte bVar31;
  uint uVar32;
  AABBNodeMB4D *node1;
  ulong uVar33;
  long lVar34;
  long lVar35;
  uint uVar36;
  long lVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  ulong uVar43;
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  ulong uVar47;
  long lVar48;
  ulong uVar49;
  byte bVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [64];
  undefined1 auVar81 [16];
  undefined1 auVar82 [64];
  undefined1 auVar83 [16];
  float fVar84;
  float fVar86;
  float fVar87;
  undefined1 auVar85 [16];
  float fVar88;
  undefined4 uVar89;
  undefined1 auVar90 [16];
  undefined1 auVar91 [64];
  undefined1 auVar92 [16];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 in_ZMM27 [64];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  undefined1 auVar101 [64];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  int local_116c;
  RayQueryContext *local_1168;
  Scene *local_1160;
  undefined1 local_1158 [16];
  undefined1 local_1148 [16];
  undefined1 local_1138 [16];
  undefined1 local_1128 [16];
  undefined1 local_1118 [16];
  Geometry *local_1108;
  long local_1100;
  long local_10f8;
  long local_10f0;
  RTCFilterFunctionNArguments local_10e8;
  float local_10b8;
  undefined4 local_10b4;
  undefined4 local_10b0;
  undefined4 local_10ac;
  undefined4 local_10a8;
  undefined4 local_10a4;
  uint local_10a0;
  uint local_109c;
  uint local_1098;
  undefined1 local_1088 [16];
  undefined8 local_1078;
  undefined8 uStack_1070;
  undefined1 local_1068 [16];
  undefined1 local_1058 [16];
  undefined1 local_1048 [16];
  undefined1 local_1038 [16];
  byte local_1027;
  float local_1018 [4];
  float local_1008 [4];
  undefined1 local_ff8 [16];
  undefined1 local_fe8 [16];
  undefined1 local_fd8 [16];
  undefined1 local_fc8 [16];
  undefined1 local_fb8 [16];
  undefined1 local_fa8 [16];
  undefined1 local_f98 [16];
  undefined8 local_f88;
  undefined8 uStack_f80;
  ulong local_f78;
  undefined4 uStack_f70;
  ulong local_f68 [487];
  ulong uVar37;
  
  local_f78 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_f78 != 8) {
    local_1168 = context;
    puVar29 = local_f68;
    aVar3 = (ray->super_RayK<1>).dir.field_0.field_1;
    auVar51 = vxorps_avx512vl(in_ZMM27._0_16_,in_ZMM27._0_16_);
    auVar97 = ZEXT1664(auVar51);
    auVar52 = vmaxss_avx512f(auVar51,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]));
    fVar84 = (ray->super_RayK<1>).tfar;
    auVar82 = ZEXT464((uint)fVar84);
    auVar53._8_4_ = 0x7fffffff;
    auVar53._0_8_ = 0x7fffffff7fffffff;
    auVar53._12_4_ = 0x7fffffff;
    auVar53 = vandps_avx512vl((undefined1  [16])aVar3,auVar53);
    auVar60._8_4_ = 0x219392ef;
    auVar60._0_8_ = 0x219392ef219392ef;
    auVar60._12_4_ = 0x219392ef;
    uStack_f70 = 0;
    uVar39 = vcmpps_avx512vl(auVar53,auVar60,1);
    bVar10 = (bool)((byte)uVar39 & 1);
    auVar55._0_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * (int)aVar3.x;
    bVar10 = (bool)((byte)(uVar39 >> 1) & 1);
    auVar55._4_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * (int)aVar3.y;
    bVar10 = (bool)((byte)(uVar39 >> 2) & 1);
    auVar55._8_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * (int)aVar3.z;
    bVar10 = (bool)((byte)(uVar39 >> 3) & 1);
    auVar55._12_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * aVar3.field_3.a;
    auVar53 = vrcp14ps_avx512vl(auVar55);
    auVar54._8_4_ = 0x3f800000;
    auVar54._0_8_ = 0x3f8000003f800000;
    auVar54._12_4_ = 0x3f800000;
    auVar54 = vfnmadd213ps_avx512vl(auVar55,auVar53,auVar54);
    auVar55 = vmaxss_avx512f(auVar51,ZEXT416((uint)fVar84));
    vfmadd132ps_fma(auVar54,auVar53,auVar53);
    auVar53 = vucomiss_avx512f(auVar51);
    auVar54 = vbroadcastss_avx512vl(auVar53);
    auVar98 = ZEXT1664(auVar54);
    vmovshdup_avx(auVar53);
    auVar54 = vshufps_avx512vl(auVar53,auVar53,0x55);
    auVar99 = ZEXT1664(auVar54);
    vshufpd_avx(auVar53,auVar53,1);
    auVar54 = vshufps_avx512vl(auVar53,auVar53,0xaa);
    auVar100 = ZEXT1664(auVar54);
    auVar73._0_4_ = auVar53._0_4_ * (ray->super_RayK<1>).org.field_0.m128[0];
    auVar73._4_4_ = auVar53._4_4_ * (ray->super_RayK<1>).org.field_0.m128[1];
    auVar73._8_4_ = auVar53._8_4_ * (ray->super_RayK<1>).org.field_0.m128[2];
    auVar73._12_4_ = auVar53._12_4_ * (ray->super_RayK<1>).org.field_0.m128[3];
    auVar53 = vshufps_avx(auVar73,auVar73,0x55);
    auVar54 = vshufps_avx(auVar73,auVar73,0xaa);
    lVar35 = 0;
    vucomiss_avx512f(auVar51);
    lVar48 = 0x20;
    vucomiss_avx512f(auVar51);
    auVar51 = vbroadcastss_avx512vl(auVar52);
    auVar101 = ZEXT1664(auVar51);
    uVar89 = auVar55._0_4_;
    auVar80 = ZEXT1664(CONCAT412(uVar89,CONCAT48(uVar89,CONCAT44(uVar89,uVar89))));
    uVar39 = CONCAT44(auVar73._0_4_,auVar73._0_4_);
    local_f98._0_8_ = uVar39 ^ 0x8000000080000000;
    local_f98._8_4_ = -auVar73._0_4_;
    local_f98._12_4_ = -auVar73._0_4_;
    auVar91 = ZEXT1664(local_f98);
    local_fa8._0_8_ = auVar53._0_8_ ^ 0x8000000080000000;
    local_fa8._8_4_ = auVar53._8_4_ ^ 0x80000000;
    local_fa8._12_4_ = auVar53._12_4_ ^ 0x80000000;
    auVar93 = ZEXT1664(local_fa8);
    local_fb8._0_8_ = auVar54._0_8_ ^ 0x8000000080000000;
    local_fb8._8_4_ = auVar54._8_4_ ^ 0x80000000;
    local_fb8._12_4_ = auVar54._12_4_ ^ 0x80000000;
    auVar94 = ZEXT1664(local_fb8);
    local_10f8 = 0;
    local_1100 = 0x20;
LAB_01ea59d6:
    do {
      pfVar1 = (float *)(puVar29 + -1);
      puVar29 = puVar29 + -2;
      if (*pfVar1 <= auVar82._0_4_) {
        uVar39 = *puVar29;
        while ((uVar39 & 8) == 0) {
          uVar33 = uVar39 & 0xfffffffffffffff0;
          uVar89 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 0xc);
          auVar52._4_4_ = uVar89;
          auVar52._0_4_ = uVar89;
          auVar52._8_4_ = uVar89;
          auVar52._12_4_ = uVar89;
          auVar53 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar33 + 0x80 + lVar35),auVar52,
                                    *(undefined1 (*) [16])(uVar33 + 0x20 + lVar35));
          auVar54 = vfmadd213ps_avx512vl(auVar53,auVar98._0_16_,auVar91._0_16_);
          auVar53 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar33 + 0x80 + lVar48),auVar52,
                                    *(undefined1 (*) [16])(uVar33 + 0x20 + lVar48));
          auVar51 = vmaxps_avx512vl(auVar101._0_16_,auVar54);
          auVar54 = vfmadd213ps_avx512vl(auVar53,auVar99._0_16_,auVar93._0_16_);
          auVar53 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar33 + 0xc0),auVar52,
                                    *(undefined1 (*) [16])(uVar33 + 0x60));
          auVar53 = vfmadd213ps_avx512vl(auVar53,auVar100._0_16_,auVar94._0_16_);
          auVar53 = vmaxps_avx(auVar54,auVar53);
          auVar54 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar33 + 0x90),auVar52,
                                    *(undefined1 (*) [16])(uVar33 + 0x30));
          local_1068 = vmaxps_avx(auVar51,auVar53);
          auVar54 = vfmadd213ps_avx512vl(auVar54,auVar98._0_16_,auVar91._0_16_);
          auVar53 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar33 + 0xb0),auVar52,
                                    *(undefined1 (*) [16])(uVar33 + 0x50));
          auVar51 = vfmadd213ps_avx512vl(auVar53,auVar99._0_16_,auVar93._0_16_);
          auVar53 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar33 + 0xd0),auVar52,
                                    *(undefined1 (*) [16])(uVar33 + 0x70));
          auVar53 = vfmadd213ps_avx512vl(auVar53,auVar100._0_16_,auVar94._0_16_);
          auVar53 = vminps_avx(auVar51,auVar53);
          auVar54 = vminps_avx(auVar80._0_16_,auVar54);
          auVar53 = vminps_avx(auVar54,auVar53);
          uVar20 = vcmpps_avx512vl(local_1068,auVar53,2);
          uVar36 = (uint)uVar20;
          if (((uint)uVar39 & 7) == 6) {
            uVar21 = vcmpps_avx512vl(auVar52,*(undefined1 (*) [16])(uVar33 + 0xf0),1);
            uVar22 = vcmpps_avx512vl(auVar52,*(undefined1 (*) [16])(uVar33 + 0xe0),0xd);
            uVar36 = (uint)(byte)((byte)uVar21 & (byte)uVar22 & (byte)uVar20);
          }
          if ((byte)uVar36 == 0) {
            auVar53 = vmovshdup_avx(*(undefined1 (*) [16])
                                     ((long)&(ray->super_RayK<1>).dir.field_0 + 0xc));
            auVar82 = ZEXT1664(auVar53);
            if (puVar29 == &local_f78) {
              return;
            }
            goto LAB_01ea59d6;
          }
          lVar38 = 0;
          for (uVar39 = (ulong)(byte)uVar36; (uVar39 & 1) == 0;
              uVar39 = uVar39 >> 1 | 0x8000000000000000) {
            lVar38 = lVar38 + 1;
          }
          uVar39 = *(ulong *)(uVar33 + lVar38 * 8);
          uVar36 = (uVar36 & 0xff) - 1 & uVar36 & 0xff;
          uVar37 = (ulong)uVar36;
          if (uVar36 != 0) {
            uVar24 = *(uint *)(local_1068 + lVar38 * 4);
            lVar38 = 0;
            for (; (uVar37 & 1) == 0; uVar37 = uVar37 >> 1 | 0x8000000000000000) {
              lVar38 = lVar38 + 1;
            }
            uVar36 = uVar36 - 1 & uVar36;
            uVar40 = (ulong)uVar36;
            uVar37 = *(ulong *)(uVar33 + lVar38 * 8);
            uVar32 = *(uint *)(local_1068 + lVar38 * 4);
            if (uVar36 == 0) {
              if (uVar24 < uVar32) {
                *puVar29 = uVar37;
                *(uint *)(puVar29 + 1) = uVar32;
                puVar29 = puVar29 + 2;
              }
              else {
                *puVar29 = uVar39;
                *(uint *)(puVar29 + 1) = uVar24;
                puVar29 = puVar29 + 2;
                uVar39 = uVar37;
              }
            }
            else {
              auVar51._8_8_ = 0;
              auVar51._0_8_ = uVar39;
              auVar53 = vpunpcklqdq_avx(auVar51,ZEXT416(uVar24));
              auVar62._8_8_ = 0;
              auVar62._0_8_ = uVar37;
              auVar54 = vpunpcklqdq_avx(auVar62,ZEXT416(uVar32));
              lVar38 = 0;
              for (; (uVar40 & 1) == 0; uVar40 = uVar40 >> 1 | 0x8000000000000000) {
                lVar38 = lVar38 + 1;
              }
              uVar36 = uVar36 - 1 & uVar36;
              uVar39 = (ulong)uVar36;
              auVar71._8_8_ = 0;
              auVar71._0_8_ = *(ulong *)(uVar33 + lVar38 * 8);
              auVar73 = vpunpcklqdq_avx(auVar71,ZEXT416(*(uint *)(local_1068 + lVar38 * 4)));
              auVar51 = vpshufd_avx(auVar53,0xaa);
              auVar52 = vpshufd_avx(auVar54,0xaa);
              auVar55 = vpshufd_avx(auVar73,0xaa);
              if (uVar36 == 0) {
                uVar39 = vpcmpgtd_avx512vl(auVar52,auVar51);
                uVar39 = uVar39 & 0xf;
                auVar52 = vpblendmd_avx512vl(auVar54,auVar53);
                bVar10 = (bool)((byte)uVar39 & 1);
                auVar56._0_4_ = (uint)bVar10 * auVar52._0_4_ | (uint)!bVar10 * auVar51._0_4_;
                bVar10 = (bool)((byte)(uVar39 >> 1) & 1);
                auVar56._4_4_ = (uint)bVar10 * auVar52._4_4_ | (uint)!bVar10 * auVar51._4_4_;
                bVar10 = (bool)((byte)(uVar39 >> 2) & 1);
                auVar56._8_4_ = (uint)bVar10 * auVar52._8_4_ | (uint)!bVar10 * auVar51._8_4_;
                bVar10 = SUB81(uVar39 >> 3,0);
                auVar56._12_4_ = (uint)bVar10 * auVar52._12_4_ | (uint)!bVar10 * auVar51._12_4_;
                auVar54 = vmovdqa32_avx512vl(auVar54);
                bVar10 = (bool)((byte)uVar39 & 1);
                auVar57._0_4_ = (uint)bVar10 * auVar54._0_4_ | (uint)!bVar10 * auVar53._0_4_;
                bVar10 = (bool)((byte)(uVar39 >> 1) & 1);
                auVar57._4_4_ = (uint)bVar10 * auVar54._4_4_ | (uint)!bVar10 * auVar53._4_4_;
                bVar10 = (bool)((byte)(uVar39 >> 2) & 1);
                auVar57._8_4_ = (uint)bVar10 * auVar54._8_4_ | (uint)!bVar10 * auVar53._8_4_;
                bVar10 = SUB81(uVar39 >> 3,0);
                auVar57._12_4_ = (uint)bVar10 * auVar54._12_4_ | (uint)!bVar10 * auVar53._12_4_;
                auVar53 = vpshufd_avx(auVar56,0xaa);
                uVar33 = vpcmpgtd_avx512vl(auVar55,auVar53);
                uVar33 = uVar33 & 0xf;
                auVar54 = vpblendmd_avx512vl(auVar73,auVar56);
                bVar10 = (bool)((byte)uVar33 & 1);
                bVar11 = (bool)((byte)(uVar33 >> 1) & 1);
                uVar39 = CONCAT44((uint)bVar11 * auVar54._4_4_ | (uint)!bVar11 * auVar53._4_4_,
                                  (uint)bVar10 * auVar54._0_4_ | (uint)!bVar10 * auVar53._0_4_);
                auVar53 = vmovdqa32_avx512vl(auVar73);
                bVar10 = (bool)((byte)uVar33 & 1);
                auVar58._0_4_ = (uint)bVar10 * auVar53._0_4_ | !bVar10 * auVar56._0_4_;
                bVar10 = (bool)((byte)(uVar33 >> 1) & 1);
                auVar58._4_4_ = (uint)bVar10 * auVar53._4_4_ | !bVar10 * auVar56._4_4_;
                bVar10 = (bool)((byte)(uVar33 >> 2) & 1);
                auVar58._8_4_ = (uint)bVar10 * auVar53._8_4_ | !bVar10 * auVar56._8_4_;
                bVar10 = SUB81(uVar33 >> 3,0);
                auVar58._12_4_ = (uint)bVar10 * auVar53._12_4_ | !bVar10 * auVar56._12_4_;
                auVar53 = vpshufd_avx(auVar58,0xaa);
                auVar54 = vpshufd_avx(auVar57,0xaa);
                uVar33 = vpcmpgtd_avx512vl(auVar53,auVar54);
                uVar33 = uVar33 & 0xf;
                auVar54 = vpblendmd_avx512vl(auVar58,auVar57);
                bVar10 = (bool)((byte)uVar33 & 1);
                bVar12 = (bool)((byte)(uVar33 >> 1) & 1);
                bVar14 = (bool)((byte)(uVar33 >> 2) & 1);
                bVar16 = SUB81(uVar33 >> 3,0);
                auVar51 = vmovdqa32_avx512vl(auVar58);
                bVar11 = (bool)((byte)uVar33 & 1);
                bVar13 = (bool)((byte)(uVar33 >> 1) & 1);
                bVar15 = (bool)((byte)(uVar33 >> 2) & 1);
                bVar17 = SUB81(uVar33 >> 3,0);
                *(uint *)puVar29 = (uint)bVar11 * auVar51._0_4_ | !bVar11 * auVar57._0_4_;
                *(uint *)((long)puVar29 + 4) =
                     (uint)bVar13 * auVar51._4_4_ | !bVar13 * auVar57._4_4_;
                *(uint *)(puVar29 + 1) = (uint)bVar15 * auVar51._8_4_ | !bVar15 * auVar57._8_4_;
                *(uint *)((long)puVar29 + 0xc) =
                     (uint)bVar17 * auVar51._12_4_ | !bVar17 * auVar57._12_4_;
                *(uint *)(puVar29 + 2) =
                     (uint)bVar10 * auVar54._0_4_ | (uint)!bVar10 * auVar53._0_4_;
                *(uint *)((long)puVar29 + 0x14) =
                     (uint)bVar12 * auVar54._4_4_ | (uint)!bVar12 * auVar53._4_4_;
                *(uint *)(puVar29 + 3) =
                     (uint)bVar14 * auVar54._8_4_ | (uint)!bVar14 * auVar53._8_4_;
                *(uint *)((long)puVar29 + 0x1c) =
                     (uint)bVar16 * auVar54._12_4_ | (uint)!bVar16 * auVar53._12_4_;
                puVar29 = puVar29 + 4;
              }
              else {
                lVar38 = 0;
                for (; (uVar39 & 1) == 0; uVar39 = uVar39 >> 1 | 0x8000000000000000) {
                  lVar38 = lVar38 + 1;
                }
                uVar36 = *(uint *)(local_1068 + lVar38 * 4);
                auVar69._8_8_ = 0;
                auVar69._0_8_ = *(ulong *)(uVar33 + lVar38 * 8);
                auVar60 = vpunpcklqdq_avx(auVar69,ZEXT416(uVar36));
                uVar39 = vpcmpgtd_avx512vl(auVar52,auVar51);
                uVar39 = uVar39 & 0xf;
                auVar52 = vpblendmd_avx512vl(auVar54,auVar53);
                bVar10 = (bool)((byte)uVar39 & 1);
                auVar72._0_4_ = (uint)bVar10 * auVar52._0_4_ | (uint)!bVar10 * auVar51._0_4_;
                bVar10 = (bool)((byte)(uVar39 >> 1) & 1);
                auVar72._4_4_ = (uint)bVar10 * auVar52._4_4_ | (uint)!bVar10 * auVar51._4_4_;
                bVar10 = (bool)((byte)(uVar39 >> 2) & 1);
                auVar72._8_4_ = (uint)bVar10 * auVar52._8_4_ | (uint)!bVar10 * auVar51._8_4_;
                bVar10 = SUB81(uVar39 >> 3,0);
                auVar72._12_4_ = (uint)bVar10 * auVar52._12_4_ | (uint)!bVar10 * auVar51._12_4_;
                auVar54 = vmovdqa32_avx512vl(auVar54);
                bVar10 = (bool)((byte)uVar39 & 1);
                auVar70._0_4_ = (uint)bVar10 * auVar54._0_4_ | (uint)!bVar10 * auVar53._0_4_;
                bVar10 = (bool)((byte)(uVar39 >> 1) & 1);
                auVar70._4_4_ = (uint)bVar10 * auVar54._4_4_ | (uint)!bVar10 * auVar53._4_4_;
                bVar10 = (bool)((byte)(uVar39 >> 2) & 1);
                auVar70._8_4_ = (uint)bVar10 * auVar54._8_4_ | (uint)!bVar10 * auVar53._8_4_;
                bVar10 = SUB81(uVar39 >> 3,0);
                auVar70._12_4_ = (uint)bVar10 * auVar54._12_4_ | (uint)!bVar10 * auVar53._12_4_;
                auVar68._4_4_ = uVar36;
                auVar68._0_4_ = uVar36;
                auVar68._8_4_ = uVar36;
                auVar68._12_4_ = uVar36;
                uVar39 = vpcmpgtd_avx512vl(auVar68,auVar55);
                uVar39 = uVar39 & 0xf;
                auVar53 = vpblendmd_avx512vl(auVar60,auVar73);
                bVar10 = (bool)((byte)uVar39 & 1);
                auVar61._0_4_ = (uint)bVar10 * auVar53._0_4_ | !bVar10 * uVar36;
                bVar10 = (bool)((byte)(uVar39 >> 1) & 1);
                auVar61._4_4_ = (uint)bVar10 * auVar53._4_4_ | !bVar10 * uVar36;
                bVar10 = (bool)((byte)(uVar39 >> 2) & 1);
                auVar61._8_4_ = (uint)bVar10 * auVar53._8_4_ | !bVar10 * uVar36;
                bVar10 = SUB81(uVar39 >> 3,0);
                auVar61._12_4_ = (uint)bVar10 * auVar53._12_4_ | !bVar10 * uVar36;
                auVar53 = vmovdqa32_avx512vl(auVar60);
                bVar10 = (bool)((byte)uVar39 & 1);
                auVar63._0_4_ = (uint)bVar10 * auVar53._0_4_ | (uint)!bVar10 * auVar73._0_4_;
                bVar10 = (bool)((byte)(uVar39 >> 1) & 1);
                auVar63._4_4_ = (uint)bVar10 * auVar53._4_4_ | (uint)!bVar10 * auVar73._4_4_;
                bVar10 = (bool)((byte)(uVar39 >> 2) & 1);
                auVar63._8_4_ = (uint)bVar10 * auVar53._8_4_ | (uint)!bVar10 * auVar73._8_4_;
                bVar10 = SUB81(uVar39 >> 3,0);
                auVar63._12_4_ = (uint)bVar10 * auVar53._12_4_ | (uint)!bVar10 * auVar73._12_4_;
                auVar53 = vpshufd_avx(auVar63,0xaa);
                auVar54 = vpshufd_avx(auVar70,0xaa);
                uVar39 = vpcmpgtd_avx512vl(auVar53,auVar54);
                uVar39 = uVar39 & 0xf;
                auVar54 = vpblendmd_avx512vl(auVar63,auVar70);
                bVar10 = (bool)((byte)uVar39 & 1);
                auVar64._0_4_ = (uint)bVar10 * auVar54._0_4_ | (uint)!bVar10 * auVar53._0_4_;
                bVar10 = (bool)((byte)(uVar39 >> 1) & 1);
                auVar64._4_4_ = (uint)bVar10 * auVar54._4_4_ | (uint)!bVar10 * auVar53._4_4_;
                bVar10 = (bool)((byte)(uVar39 >> 2) & 1);
                auVar64._8_4_ = (uint)bVar10 * auVar54._8_4_ | (uint)!bVar10 * auVar53._8_4_;
                bVar10 = SUB81(uVar39 >> 3,0);
                auVar64._12_4_ = (uint)bVar10 * auVar54._12_4_ | (uint)!bVar10 * auVar53._12_4_;
                auVar51 = vmovdqa32_avx512vl(auVar63);
                bVar10 = (bool)((byte)uVar39 & 1);
                bVar12 = (bool)((byte)(uVar39 >> 1) & 1);
                bVar14 = (bool)((byte)(uVar39 >> 2) & 1);
                bVar15 = SUB81(uVar39 >> 3,0);
                auVar53 = vpshufd_avx(auVar61,0xaa);
                auVar54 = vpshufd_avx(auVar72,0xaa);
                uVar33 = vpcmpgtd_avx512vl(auVar53,auVar54);
                uVar33 = uVar33 & 0xf;
                auVar54 = vpblendmd_avx512vl(auVar61,auVar72);
                bVar11 = (bool)((byte)uVar33 & 1);
                bVar13 = (bool)((byte)(uVar33 >> 1) & 1);
                uVar39 = CONCAT44((uint)bVar13 * auVar54._4_4_ | (uint)!bVar13 * auVar53._4_4_,
                                  (uint)bVar11 * auVar54._0_4_ | (uint)!bVar11 * auVar53._0_4_);
                auVar53 = vmovdqa32_avx512vl(auVar61);
                bVar11 = (bool)((byte)uVar33 & 1);
                auVar67._0_4_ = (uint)bVar11 * auVar53._0_4_ | !bVar11 * auVar72._0_4_;
                bVar11 = (bool)((byte)(uVar33 >> 1) & 1);
                auVar67._4_4_ = (uint)bVar11 * auVar53._4_4_ | !bVar11 * auVar72._4_4_;
                bVar11 = (bool)((byte)(uVar33 >> 2) & 1);
                auVar67._8_4_ = (uint)bVar11 * auVar53._8_4_ | !bVar11 * auVar72._8_4_;
                bVar11 = SUB81(uVar33 >> 3,0);
                auVar67._12_4_ = (uint)bVar11 * auVar53._12_4_ | !bVar11 * auVar72._12_4_;
                auVar53 = vpshufd_avx(auVar67,0xaa);
                auVar54 = vpshufd_avx(auVar64,0xaa);
                uVar33 = vpcmpgtd_avx512vl(auVar54,auVar53);
                uVar33 = uVar33 & 0xf;
                auVar54 = vpblendmd_avx512vl(auVar64,auVar67);
                bVar11 = (bool)((byte)uVar33 & 1);
                auVar65._0_4_ = (uint)bVar11 * auVar54._0_4_ | (uint)!bVar11 * auVar53._0_4_;
                bVar11 = (bool)((byte)(uVar33 >> 1) & 1);
                auVar65._4_4_ = (uint)bVar11 * auVar54._4_4_ | (uint)!bVar11 * auVar53._4_4_;
                bVar11 = (bool)((byte)(uVar33 >> 2) & 1);
                auVar65._8_4_ = (uint)bVar11 * auVar54._8_4_ | (uint)!bVar11 * auVar53._8_4_;
                bVar11 = SUB81(uVar33 >> 3,0);
                auVar65._12_4_ = (uint)bVar11 * auVar54._12_4_ | (uint)!bVar11 * auVar53._12_4_;
                auVar53 = vmovdqa32_avx512vl(auVar64);
                bVar11 = (bool)((byte)uVar33 & 1);
                auVar66._0_4_ = (uint)bVar11 * auVar53._0_4_ | !bVar11 * auVar67._0_4_;
                bVar11 = (bool)((byte)(uVar33 >> 1) & 1);
                auVar66._4_4_ = (uint)bVar11 * auVar53._4_4_ | !bVar11 * auVar67._4_4_;
                bVar11 = (bool)((byte)(uVar33 >> 2) & 1);
                auVar66._8_4_ = (uint)bVar11 * auVar53._8_4_ | !bVar11 * auVar67._8_4_;
                bVar11 = SUB81(uVar33 >> 3,0);
                auVar66._12_4_ = (uint)bVar11 * auVar53._12_4_ | !bVar11 * auVar67._12_4_;
                *(uint *)puVar29 = (uint)bVar10 * auVar51._0_4_ | !bVar10 * auVar70._0_4_;
                *(uint *)((long)puVar29 + 4) =
                     (uint)bVar12 * auVar51._4_4_ | !bVar12 * auVar70._4_4_;
                *(uint *)(puVar29 + 1) = (uint)bVar14 * auVar51._8_4_ | !bVar14 * auVar70._8_4_;
                *(uint *)((long)puVar29 + 0xc) =
                     (uint)bVar15 * auVar51._12_4_ | !bVar15 * auVar70._12_4_;
                *(undefined1 (*) [16])(puVar29 + 2) = auVar66;
                *(undefined1 (*) [16])(puVar29 + 4) = auVar65;
                puVar29 = puVar29 + 6;
              }
            }
          }
        }
        local_10f0 = (ulong)((uint)uVar39 & 0xf) - 8;
        if (local_10f0 != 0) {
          uVar39 = uVar39 & 0xfffffffffffffff0;
          local_1160 = local_1168->scene;
          lVar35 = 0;
          do {
            lVar34 = lVar35 * 0x50;
            pGVar8 = (local_1160->geometries).items[*(uint *)(uVar39 + 0x30 + lVar34)].ptr;
            fVar84 = (pGVar8->time_range).lower;
            fVar84 = pGVar8->fnumTimeSegments *
                     (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar84) /
                     ((pGVar8->time_range).upper - fVar84));
            auVar53 = vroundss_avx(ZEXT416((uint)fVar84),ZEXT416((uint)fVar84),9);
            auVar53 = vminss_avx(auVar53,ZEXT416((uint)(pGVar8->fnumTimeSegments + -1.0)));
            auVar59 = vmaxss_avx512f(auVar97._0_16_,auVar53);
            lVar38 = (long)(int)auVar59._0_4_ * 0x38;
            lVar48 = *(long *)(*(long *)&pGVar8[2].numPrimitives + lVar38);
            auVar53 = *(undefined1 (*) [16])(lVar48 + (ulong)*(uint *)(uVar39 + lVar34) * 4);
            uVar33 = (ulong)*(uint *)(uVar39 + 0x10 + lVar34);
            auVar54 = *(undefined1 (*) [16])(lVar48 + uVar33 * 4);
            uVar37 = CONCAT44(0,*(uint *)(uVar39 + 0x20 + lVar34));
            local_1118._0_8_ = uVar37;
            auVar51 = *(undefined1 (*) [16])(lVar48 + uVar37 * 4);
            uVar40 = CONCAT44(0,*(uint *)(uVar39 + 4 + lVar34));
            local_1128._0_8_ = uVar40;
            auVar52 = *(undefined1 (*) [16])(lVar48 + uVar40 * 4);
            uVar41 = CONCAT44(0,*(uint *)(uVar39 + 0x14 + lVar34));
            local_1138._0_8_ = uVar41;
            auVar55 = *(undefined1 (*) [16])(lVar48 + uVar41 * 4);
            uVar42 = CONCAT44(0,*(uint *)(uVar39 + 0x24 + lVar34));
            local_1148._0_8_ = uVar42;
            auVar73 = *(undefined1 (*) [16])(lVar48 + uVar42 * 4);
            uVar43 = CONCAT44(0,*(uint *)(uVar39 + 8 + lVar34));
            local_1158._0_8_ = uVar43;
            auVar60 = *(undefined1 (*) [16])(lVar48 + uVar43 * 4);
            uVar49 = (ulong)*(uint *)(uVar39 + 0x18 + lVar34);
            auVar62 = *(undefined1 (*) [16])(lVar48 + uVar49 * 4);
            uVar47 = (ulong)*(uint *)(uVar39 + 0x28 + lVar34);
            auVar71 = *(undefined1 (*) [16])(lVar48 + uVar47 * 4);
            uVar46 = (ulong)*(uint *)(uVar39 + 0xc + lVar34);
            auVar72 = *(undefined1 (*) [16])(lVar48 + uVar46 * 4);
            uVar45 = (ulong)*(uint *)(uVar39 + 0x1c + lVar34);
            auVar70 = *(undefined1 (*) [16])(lVar48 + uVar45 * 4);
            lVar38 = *(long *)(*(long *)&pGVar8[2].numPrimitives + 0x38 + lVar38);
            uVar44 = (ulong)*(uint *)(uVar39 + 0x2c + lVar34);
            auVar61 = *(undefined1 (*) [16])(lVar48 + uVar44 * 4);
            auVar63 = *(undefined1 (*) [16])(lVar38 + (ulong)*(uint *)(uVar39 + lVar34) * 4);
            auVar64 = *(undefined1 (*) [16])(lVar38 + uVar33 * 4);
            auVar67 = *(undefined1 (*) [16])(lVar38 + uVar37 * 4);
            auVar65 = *(undefined1 (*) [16])(lVar38 + uVar40 * 4);
            auVar66 = *(undefined1 (*) [16])(lVar38 + uVar41 * 4);
            auVar68 = *(undefined1 (*) [16])(lVar38 + uVar42 * 4);
            auVar69 = *(undefined1 (*) [16])(lVar38 + uVar43 * 4);
            auVar56 = *(undefined1 (*) [16])(lVar38 + uVar49 * 4);
            auVar57 = *(undefined1 (*) [16])(lVar38 + uVar47 * 4);
            auVar58 = *(undefined1 (*) [16])(lVar38 + uVar46 * 4);
            auVar4 = *(undefined1 (*) [16])(lVar38 + uVar45 * 4);
            auVar5 = *(undefined1 (*) [16])(lVar38 + uVar44 * 4);
            puVar2 = (undefined8 *)(uVar39 + 0x30 + lVar34);
            local_f88 = *puVar2;
            uStack_f80 = puVar2[1];
            puVar2 = (undefined8 *)(uVar39 + 0x40 + lVar34);
            auVar18 = vunpcklps_avx(auVar53,auVar60);
            auVar53 = vunpckhps_avx(auVar53,auVar60);
            auVar60 = vunpcklps_avx(auVar52,auVar72);
            auVar52 = vunpckhps_avx(auVar52,auVar72);
            auVar72 = vunpcklps_avx(auVar53,auVar52);
            auVar19 = vunpcklps_avx(auVar18,auVar60);
            auVar53 = vunpckhps_avx(auVar18,auVar60);
            auVar60 = vunpcklps_avx(auVar54,auVar62);
            auVar54 = vunpckhps_avx(auVar54,auVar62);
            auVar62 = vunpcklps_avx(auVar55,auVar70);
            auVar52 = vunpckhps_avx(auVar55,auVar70);
            auVar55 = vunpcklps_avx(auVar54,auVar52);
            auVar70 = vunpcklps_avx(auVar60,auVar62);
            auVar54 = vunpckhps_avx(auVar60,auVar62);
            auVar60 = vunpcklps_avx(auVar51,auVar71);
            auVar51 = vunpckhps_avx(auVar51,auVar71);
            auVar62 = vunpcklps_avx(auVar73,auVar61);
            auVar52 = vunpckhps_avx(auVar73,auVar61);
            auVar73 = vunpcklps_avx(auVar51,auVar52);
            auVar71 = vunpcklps_avx(auVar60,auVar62);
            auVar51 = vunpckhps_avx(auVar60,auVar62);
            auVar52 = vunpcklps_avx512vl(auVar63,auVar69);
            auVar60 = vunpckhps_avx512vl(auVar63,auVar69);
            auVar61 = vunpcklps_avx512vl(auVar65,auVar58);
            auVar62 = vunpckhps_avx512vl(auVar65,auVar58);
            auVar60 = vunpcklps_avx(auVar60,auVar62);
            auVar62 = vunpcklps_avx(auVar52,auVar61);
            auVar52 = vunpckhps_avx(auVar52,auVar61);
            auVar61 = vunpcklps_avx512vl(auVar64,auVar56);
            auVar63 = vunpckhps_avx512vl(auVar64,auVar56);
            auVar64 = vunpcklps_avx512vl(auVar66,auVar4);
            auVar65 = vunpckhps_avx512vl(auVar66,auVar4);
            auVar63 = vunpcklps_avx512vl(auVar63,auVar65);
            auVar65 = vunpcklps_avx512vl(auVar61,auVar64);
            auVar64 = vunpckhps_avx512vl(auVar61,auVar64);
            auVar66 = vunpcklps_avx512vl(auVar67,auVar57);
            auVar61 = vunpckhps_avx512vl(auVar67,auVar57);
            auVar67 = vunpcklps_avx512vl(auVar68,auVar5);
            auVar68 = vunpckhps_avx512vl(auVar68,auVar5);
            auVar61 = vunpcklps_avx(auVar61,auVar68);
            auVar68 = vunpcklps_avx512vl(auVar66,auVar67);
            auVar67 = vunpckhps_avx512vl(auVar66,auVar67);
            auVar69 = ZEXT416((uint)(fVar84 - auVar59._0_4_));
            auVar66 = vbroadcastss_avx512vl(auVar69);
            auVar69 = vsubss_avx512f(ZEXT416(0x3f800000),auVar69);
            auVar76._0_4_ = auVar69._0_4_;
            auVar76._4_4_ = auVar76._0_4_;
            auVar76._8_4_ = auVar76._0_4_;
            auVar76._12_4_ = auVar76._0_4_;
            auVar62 = vmulps_avx512vl(auVar66,auVar62);
            auVar52 = vmulps_avx512vl(auVar66,auVar52);
            auVar69 = vmulps_avx512vl(auVar66,auVar60);
            auVar60 = vfmadd231ps_fma(auVar62,auVar76,auVar19);
            auVar62 = vfmadd231ps_fma(auVar52,auVar76,auVar53);
            auVar72 = vfmadd231ps_fma(auVar69,auVar76,auVar72);
            auVar53 = vmulps_avx512vl(auVar66,auVar65);
            auVar52 = vmulps_avx512vl(auVar66,auVar64);
            auVar63 = vmulps_avx512vl(auVar66,auVar63);
            auVar53 = vfmadd231ps_fma(auVar53,auVar76,auVar70);
            auVar54 = vfmadd231ps_fma(auVar52,auVar76,auVar54);
            auVar52 = vfmadd231ps_fma(auVar63,auVar76,auVar55);
            auVar55 = vmulps_avx512vl(auVar66,auVar68);
            auVar70 = vmulps_avx512vl(auVar66,auVar67);
            auVar61 = vmulps_avx512vl(auVar66,auVar61);
            auVar55 = vfmadd231ps_fma(auVar55,auVar76,auVar71);
            auVar71 = vfmadd231ps_fma(auVar70,auVar76,auVar51);
            auVar73 = vfmadd231ps_fma(auVar61,auVar76,auVar73);
            local_1078 = *puVar2;
            uStack_1070 = puVar2[1];
            auVar53 = vsubps_avx(auVar60,auVar53);
            auVar54 = vsubps_avx(auVar62,auVar54);
            auVar51 = vsubps_avx(auVar72,auVar52);
            auVar52 = vsubps_avx(auVar55,auVar60);
            auVar55 = vsubps_avx(auVar71,auVar62);
            auVar73 = vsubps_avx(auVar73,auVar72);
            auVar77._0_4_ = auVar73._0_4_ * auVar54._0_4_;
            auVar77._4_4_ = auVar73._4_4_ * auVar54._4_4_;
            auVar77._8_4_ = auVar73._8_4_ * auVar54._8_4_;
            auVar77._12_4_ = auVar73._12_4_ * auVar54._12_4_;
            local_fe8 = vfmsub231ps_fma(auVar77,auVar55,auVar51);
            auVar81._0_4_ = auVar51._0_4_ * auVar52._0_4_;
            auVar81._4_4_ = auVar51._4_4_ * auVar52._4_4_;
            auVar81._8_4_ = auVar51._8_4_ * auVar52._8_4_;
            auVar81._12_4_ = auVar51._12_4_ * auVar52._12_4_;
            local_fd8 = vfmsub231ps_fma(auVar81,auVar73,auVar53);
            auVar83._0_4_ = auVar53._0_4_ * auVar55._0_4_;
            auVar83._4_4_ = auVar53._4_4_ * auVar55._4_4_;
            auVar83._8_4_ = auVar53._8_4_ * auVar55._8_4_;
            auVar83._12_4_ = auVar53._12_4_ * auVar55._12_4_;
            fVar84 = (ray->super_RayK<1>).dir.field_0.m128[0];
            auVar85._4_4_ = fVar84;
            auVar85._0_4_ = fVar84;
            auVar85._8_4_ = fVar84;
            auVar85._12_4_ = fVar84;
            auVar71 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).dir.field_0.m128[1]))
            ;
            auVar70 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).dir.field_0.m128[2]))
            ;
            uVar89 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
            auVar4._4_4_ = uVar89;
            auVar4._0_4_ = uVar89;
            auVar4._8_4_ = uVar89;
            auVar4._12_4_ = uVar89;
            auVar61 = vsubps_avx512vl(auVar60,auVar4);
            local_fc8 = vfmsub231ps_fma(auVar83,auVar52,auVar54);
            uVar89 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
            auVar5._4_4_ = uVar89;
            auVar5._0_4_ = uVar89;
            auVar5._8_4_ = uVar89;
            auVar5._12_4_ = uVar89;
            auVar62 = vsubps_avx512vl(auVar62,auVar5);
            uVar89 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
            auVar18._4_4_ = uVar89;
            auVar18._0_4_ = uVar89;
            auVar18._8_4_ = uVar89;
            auVar18._12_4_ = uVar89;
            auVar72 = vsubps_avx512vl(auVar72,auVar18);
            auVar60 = vmulps_avx512vl(auVar71,auVar72);
            auVar63 = vfmsub231ps_avx512vl(auVar60,auVar62,auVar70);
            auVar60 = vmulps_avx512vl(auVar70,auVar61);
            auVar60 = vfmsub231ps_fma(auVar60,auVar72,auVar85);
            auVar96._0_4_ = fVar84 * auVar62._0_4_;
            auVar96._4_4_ = fVar84 * auVar62._4_4_;
            auVar96._8_4_ = fVar84 * auVar62._8_4_;
            auVar96._12_4_ = fVar84 * auVar62._12_4_;
            auVar64 = vfmsub231ps_avx512vl(auVar96,auVar61,auVar71);
            auVar70 = vmulps_avx512vl(local_fc8,auVar70);
            auVar71 = vfmadd231ps_avx512vl(auVar70,local_fd8,auVar71);
            auVar71 = vfmadd231ps_avx512vl(auVar71,local_fe8,auVar85);
            auVar19._8_4_ = 0x7fffffff;
            auVar19._0_8_ = 0x7fffffff7fffffff;
            auVar19._12_4_ = 0x7fffffff;
            local_1038 = vandps_avx512vl(auVar71,auVar19);
            auVar73 = vmulps_avx512vl(auVar73,auVar64);
            auVar55 = vfmadd231ps_avx512vl(auVar73,auVar60,auVar55);
            auVar52 = vfmadd231ps_avx512vl(auVar55,auVar63,auVar52);
            auVar59._8_4_ = 0x80000000;
            auVar59._0_8_ = 0x8000000080000000;
            auVar59._12_4_ = 0x80000000;
            auVar55 = vandpd_avx512vl(auVar71,auVar59);
            local_1068 = vxorps_avx512vl(auVar55,auVar52);
            auVar95._0_4_ = auVar51._0_4_ * auVar64._0_4_;
            auVar95._4_4_ = auVar51._4_4_ * auVar64._4_4_;
            auVar95._8_4_ = auVar51._8_4_ * auVar64._8_4_;
            auVar95._12_4_ = auVar51._12_4_ * auVar64._12_4_;
            auVar54 = vfmadd231ps_fma(auVar95,auVar54,auVar60);
            auVar53 = vfmadd231ps_fma(auVar54,auVar53,auVar63);
            local_1058._0_4_ = (float)(auVar55._0_4_ ^ auVar53._0_4_);
            local_1058._4_4_ = (float)(auVar55._4_4_ ^ auVar53._4_4_);
            local_1058._8_4_ = (float)(auVar55._8_4_ ^ auVar53._8_4_);
            local_1058._12_4_ = (float)(auVar55._12_4_ ^ auVar53._12_4_);
            auVar53 = ZEXT816(0) << 0x20;
            uVar20 = vcmpps_avx512vl(local_1068,auVar53,5);
            uVar21 = vcmpps_avx512vl(local_1058,auVar53,5);
            uVar22 = vcmpps_avx512vl(auVar71,auVar53,4);
            auVar92._0_4_ = local_1068._0_4_ + local_1058._0_4_;
            auVar92._4_4_ = local_1068._4_4_ + local_1058._4_4_;
            auVar92._8_4_ = local_1068._8_4_ + local_1058._8_4_;
            auVar92._12_4_ = local_1068._12_4_ + local_1058._12_4_;
            uVar23 = vcmpps_avx512vl(auVar92,local_1038,2);
            bVar50 = (byte)uVar20 & (byte)uVar21 & (byte)uVar22 & (byte)uVar23;
            if (bVar50 != 0) {
              auVar90._0_4_ = auVar72._0_4_ * local_fc8._0_4_;
              auVar90._4_4_ = auVar72._4_4_ * local_fc8._4_4_;
              auVar90._8_4_ = auVar72._8_4_ * local_fc8._8_4_;
              auVar90._12_4_ = auVar72._12_4_ * local_fc8._12_4_;
              auVar53 = vfmadd213ps_fma(auVar62,local_fd8,auVar90);
              auVar53 = vfmadd213ps_fma(auVar61,local_fe8,auVar53);
              local_1048._0_4_ = (float)(auVar55._0_4_ ^ auVar53._0_4_);
              local_1048._4_4_ = (float)(auVar55._4_4_ ^ auVar53._4_4_);
              local_1048._8_4_ = (float)(auVar55._8_4_ ^ auVar53._8_4_);
              local_1048._12_4_ = (float)(auVar55._12_4_ ^ auVar53._12_4_);
              uVar89 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
              auVar25._4_4_ = uVar89;
              auVar25._0_4_ = uVar89;
              auVar25._8_4_ = uVar89;
              auVar25._12_4_ = uVar89;
              auVar53 = vmulps_avx512vl(local_1038,auVar25);
              fVar84 = (ray->super_RayK<1>).tfar;
              auVar26._4_4_ = fVar84;
              auVar26._0_4_ = fVar84;
              auVar26._8_4_ = fVar84;
              auVar26._12_4_ = fVar84;
              auVar54 = vmulps_avx512vl(local_1038,auVar26);
              uVar20 = vcmpps_avx512vl(local_1048,auVar54,2);
              uVar21 = vcmpps_avx512vl(auVar53,local_1048,1);
              bVar50 = (byte)uVar20 & (byte)uVar21 & bVar50;
              if (bVar50 != 0) {
                auVar6._0_4_ = (ray->super_RayK<1>).tfar;
                auVar6._4_4_ = (ray->super_RayK<1>).mask;
                auVar6._8_4_ = (ray->super_RayK<1>).id;
                auVar6._12_4_ = (ray->super_RayK<1>).flags;
                auVar82 = ZEXT1664(auVar6);
                uVar36 = vextractps_avx(auVar6,1);
                local_1027 = bVar50;
                auVar53 = vrcp14ps_avx512vl(local_1038);
                auVar27._8_4_ = 0x3f800000;
                auVar27._0_8_ = 0x3f8000003f800000;
                auVar27._12_4_ = 0x3f800000;
                auVar54 = vfnmadd213ps_avx512vl(local_1038,auVar53,auVar27);
                auVar53 = vfmadd132ps_fma(auVar54,auVar53,auVar53);
                fVar84 = auVar53._0_4_;
                local_ff8._0_4_ = fVar84 * local_1048._0_4_;
                fVar86 = auVar53._4_4_;
                local_ff8._4_4_ = fVar86 * local_1048._4_4_;
                fVar87 = auVar53._8_4_;
                local_ff8._8_4_ = fVar87 * local_1048._8_4_;
                fVar88 = auVar53._12_4_;
                local_ff8._12_4_ = fVar88 * local_1048._12_4_;
                auVar80 = ZEXT1664(local_ff8);
                local_1018[0] = fVar84 * local_1068._0_4_;
                local_1018[1] = fVar86 * local_1068._4_4_;
                local_1018[2] = fVar87 * local_1068._8_4_;
                local_1018[3] = fVar88 * local_1068._12_4_;
                local_1008[0] = fVar84 * local_1058._0_4_;
                local_1008[1] = fVar86 * local_1058._4_4_;
                local_1008[2] = fVar87 * local_1058._8_4_;
                local_1008[3] = fVar88 * local_1058._12_4_;
                auVar78._8_4_ = 0x7f800000;
                auVar78._0_8_ = 0x7f8000007f800000;
                auVar78._12_4_ = 0x7f800000;
                auVar53 = vblendmps_avx512vl(auVar78,local_ff8);
                auVar74._0_4_ =
                     (uint)(bVar50 & 1) * auVar53._0_4_ | (uint)!(bool)(bVar50 & 1) * 0x7f800000;
                bVar10 = (bool)(bVar50 >> 1 & 1);
                auVar74._4_4_ = (uint)bVar10 * auVar53._4_4_ | (uint)!bVar10 * 0x7f800000;
                bVar10 = (bool)(bVar50 >> 2 & 1);
                auVar74._8_4_ = (uint)bVar10 * auVar53._8_4_ | (uint)!bVar10 * 0x7f800000;
                bVar10 = (bool)(bVar50 >> 3 & 1);
                auVar74._12_4_ = (uint)bVar10 * auVar53._12_4_ | (uint)!bVar10 * 0x7f800000;
                auVar53 = vshufps_avx(auVar74,auVar74,0xb1);
                auVar53 = vminps_avx(auVar53,auVar74);
                auVar54 = vshufpd_avx(auVar53,auVar53,1);
                auVar53 = vminps_avx(auVar54,auVar53);
                uVar20 = vcmpps_avx512vl(auVar74,auVar53,0);
                bVar31 = (byte)uVar20 & bVar50;
                do {
                  auVar53 = auVar97._0_16_;
                  bVar30 = bVar50;
                  if (bVar31 != 0) {
                    bVar30 = bVar31;
                  }
                  uVar24 = 0;
                  for (uVar32 = (uint)bVar30; (uVar32 & 1) == 0; uVar32 = uVar32 >> 1 | 0x80000000)
                  {
                    uVar24 = uVar24 + 1;
                  }
                  local_10a0 = *(uint *)((long)&local_f88 + (ulong)uVar24 * 4);
                  local_1108 = (local_1160->geometries).items[local_10a0].ptr;
                  if ((local_1108->mask & uVar36) == 0) {
                    bVar50 = ~(byte)(1 << (uVar24 & 0x1f)) & bVar50;
                  }
                  else {
                    pRVar9 = local_1168->args;
                    local_1088 = auVar82._0_16_;
                    auVar54 = auVar80._0_16_;
                    auVar73 = auVar101._0_16_;
                    auVar55 = auVar100._0_16_;
                    auVar52 = auVar99._0_16_;
                    auVar51 = auVar98._0_16_;
                    if (pRVar9->filter == (RTCFilterFunctionN)0x0) {
                      local_10e8.context = local_1168->user;
                      if (local_1108->intersectionFilterN == (RTCFilterFunctionN)0x0) {
                        uVar33 = (ulong)(uVar24 << 2);
                        fVar84 = *(float *)((long)local_1018 + uVar33);
                        fVar86 = *(float *)((long)local_1008 + uVar33);
                        (ray->super_RayK<1>).tfar = *(float *)(local_ff8 + uVar33);
                        (ray->Ng).field_0.field_0.x = *(float *)(local_fe8 + uVar33);
                        (ray->Ng).field_0.field_0.y = *(float *)(local_fd8 + uVar33);
                        (ray->Ng).field_0.field_0.z = *(float *)(local_fc8 + uVar33);
                        ray->u = fVar84;
                        ray->v = fVar86;
                        ray->primID = *(uint *)((long)&local_1078 + uVar33);
                        ray->geomID = local_10a0;
                        ray->instID[0] = (local_10e8.context)->instID[0];
                        ray->instPrimID[0] = (local_10e8.context)->instPrimID[0];
                        break;
                      }
                      local_1158 = auVar54;
                      local_1148 = auVar73;
                      local_1138 = auVar55;
                      local_1128 = auVar52;
                      local_1118 = auVar51;
                    }
                    else {
                      local_1158 = auVar54;
                      local_1148 = auVar73;
                      local_1138 = auVar55;
                      local_1128 = auVar52;
                      local_1118 = auVar51;
                      local_10e8.context = local_1168->user;
                    }
                    uVar33 = (ulong)(uVar24 * 4);
                    local_10b8 = *(float *)(local_fe8 + uVar33);
                    local_10b4 = *(undefined4 *)(local_fd8 + uVar33);
                    local_10b0 = *(undefined4 *)(local_fc8 + uVar33);
                    local_10ac = *(undefined4 *)((long)local_1018 + uVar33);
                    local_10a8 = *(undefined4 *)((long)local_1008 + uVar33);
                    local_10a4 = *(undefined4 *)((long)&local_1078 + uVar33);
                    local_109c = (local_10e8.context)->instID[0];
                    local_1098 = (local_10e8.context)->instPrimID[0];
                    (ray->super_RayK<1>).tfar = *(float *)(local_ff8 + uVar33);
                    local_116c = -1;
                    local_10e8.valid = &local_116c;
                    local_10e8.geometryUserPtr = local_1108->userPtr;
                    local_10e8.ray = (RTCRayN *)ray;
                    local_10e8.hit = (RTCHitN *)&local_10b8;
                    local_10e8.N = 1;
                    local_1158 = auVar54;
                    local_1148 = auVar73;
                    local_1138 = auVar55;
                    local_1128 = auVar52;
                    local_1118 = auVar51;
                    if (((local_1108->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                        ((*local_1108->intersectionFilterN)(&local_10e8), *local_10e8.valid != 0))
                       && ((pRVar9->filter == (RTCFilterFunctionN)0x0 ||
                           ((((pRVar9->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                              RTC_RAY_QUERY_FLAG_INCOHERENT &&
                             (((local_1108->field_8).field_0x2 & 0x40) == 0)) ||
                            ((*pRVar9->filter)(&local_10e8), *local_10e8.valid != 0)))))) {
                      (((Vec3f *)((long)local_10e8.ray + 0x30))->field_0).field_0.x =
                           *(float *)local_10e8.hit;
                      (((Vec3f *)((long)local_10e8.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_10e8.hit + 4);
                      (((Vec3f *)((long)local_10e8.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_10e8.hit + 8);
                      *(float *)((long)local_10e8.ray + 0x3c) = *(float *)(local_10e8.hit + 0xc);
                      *(float *)((long)local_10e8.ray + 0x40) = *(float *)(local_10e8.hit + 0x10);
                      *(float *)((long)local_10e8.ray + 0x44) = *(float *)(local_10e8.hit + 0x14);
                      *(float *)((long)local_10e8.ray + 0x48) = *(float *)(local_10e8.hit + 0x18);
                      *(float *)((long)local_10e8.ray + 0x4c) = *(float *)(local_10e8.hit + 0x1c);
                      *(float *)((long)local_10e8.ray + 0x50) = *(float *)(local_10e8.hit + 0x20);
                    }
                    else {
                      (ray->super_RayK<1>).tfar = (float)local_1088._0_4_;
                    }
                    auVar7._0_4_ = (ray->super_RayK<1>).tfar;
                    auVar7._4_4_ = (ray->super_RayK<1>).mask;
                    auVar7._8_4_ = (ray->super_RayK<1>).id;
                    auVar7._12_4_ = (ray->super_RayK<1>).flags;
                    auVar82 = ZEXT1664(auVar7);
                    auVar80 = ZEXT1664(local_1158);
                    fVar84 = (ray->super_RayK<1>).tfar;
                    auVar28._4_4_ = fVar84;
                    auVar28._0_4_ = fVar84;
                    auVar28._8_4_ = fVar84;
                    auVar28._12_4_ = fVar84;
                    uVar20 = vcmpps_avx512vl(local_1158,auVar28,2);
                    bVar50 = ~(byte)(1 << (uVar24 & 0x1f)) & bVar50 & (byte)uVar20;
                    uVar36 = vextractps_avx(auVar7,1);
                    auVar53 = vxorps_avx512vl(auVar53,auVar53);
                    auVar97 = ZEXT1664(auVar53);
                    auVar98 = ZEXT1664(local_1118);
                    auVar99 = ZEXT1664(local_1128);
                    auVar100 = ZEXT1664(local_1138);
                    auVar101 = ZEXT1664(local_1148);
                  }
                  if (bVar50 == 0) break;
                  auVar79._8_4_ = 0x7f800000;
                  auVar79._0_8_ = 0x7f8000007f800000;
                  auVar79._12_4_ = 0x7f800000;
                  auVar53 = vblendmps_avx512vl(auVar79,auVar80._0_16_);
                  auVar75._0_4_ =
                       (uint)(bVar50 & 1) * auVar53._0_4_ | (uint)!(bool)(bVar50 & 1) * 0x7f800000;
                  bVar10 = (bool)(bVar50 >> 1 & 1);
                  auVar75._4_4_ = (uint)bVar10 * auVar53._4_4_ | (uint)!bVar10 * 0x7f800000;
                  bVar10 = (bool)(bVar50 >> 2 & 1);
                  auVar75._8_4_ = (uint)bVar10 * auVar53._8_4_ | (uint)!bVar10 * 0x7f800000;
                  bVar10 = (bool)(bVar50 >> 3 & 1);
                  auVar75._12_4_ = (uint)bVar10 * auVar53._12_4_ | (uint)!bVar10 * 0x7f800000;
                  auVar53 = vshufps_avx(auVar75,auVar75,0xb1);
                  auVar53 = vminps_avx(auVar53,auVar75);
                  auVar54 = vshufpd_avx(auVar53,auVar53,1);
                  auVar53 = vminps_avx(auVar54,auVar53);
                  uVar20 = vcmpps_avx512vl(auVar75,auVar53,0);
                  bVar31 = (byte)uVar20 & bVar50;
                } while( true );
              }
            }
            lVar35 = lVar35 + 1;
          } while (lVar35 != local_10f0);
        }
        fVar84 = (ray->super_RayK<1>).tfar;
        auVar80 = ZEXT1664(CONCAT412(fVar84,CONCAT48(fVar84,CONCAT44(fVar84,fVar84))));
        auVar82 = ZEXT464((uint)(ray->super_RayK<1>).tfar);
        auVar91 = ZEXT1664(local_f98);
        auVar93 = ZEXT1664(local_fa8);
        auVar94 = ZEXT1664(local_fb8);
        lVar35 = local_10f8;
        lVar48 = local_1100;
      }
    } while (puVar29 != &local_f78);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }